

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setWindowRole(QWidget *this,QString *role)

{
  QWidgetPrivate *this_00;
  QTLWExtra *pQVar1;
  QWindow *pQVar2;
  long lVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createTLExtra(this_00);
  pQVar1 = QWidgetPrivate::topData(this_00);
  QString::operator=(&pQVar1->role,(QString *)role);
  pQVar2 = windowHandle(this);
  if (pQVar2 != (QWindow *)0x0) {
    lVar3 = QWindow::handle();
    if (lVar3 != 0) {
      auVar5 = __dynamic_cast(lVar3,&QPlatformWindow::typeinfo,
                              &QNativeInterface::Private::QXcbWindow::typeinfo,0xfffffffffffffffe);
      plVar4 = auVar5._0_8_;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x18))(plVar4,role,auVar5._8_8_,*(code **)(*plVar4 + 0x18));
        return;
      }
    }
  }
  return;
}

Assistant:

void QWidget::setWindowRole(const QString &role)
{
#if QT_CONFIG(xcb)
    Q_D(QWidget);
    d->createTLExtra();
    d->topData()->role = role;
    if (windowHandle()) {
        if (auto *xcbWindow = dynamic_cast<QXcbWindow*>(windowHandle()->handle()))
            xcbWindow->setWindowRole(role);
    }
#else
    Q_UNUSED(role);
#endif
}